

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O3

void * raviX_ptrlist_iter_prev(PtrListIterator *self)

{
  void *pvVar1;
  PtrList *pPVar2;
  uint uVar3;
  
  if (self->__head == (PtrList *)0x0) {
    return (void *)0x0;
  }
  uVar3 = self->__nr - 1;
  self->__nr = uVar3;
  pPVar2 = self->__list;
  do {
    if (((int)uVar3 < 0) || ((int)(char)*(undefined4 *)pPVar2 <= (int)uVar3)) {
      pPVar2 = pPVar2->prev_;
      if (pPVar2 == self->__head) {
        return (void *)0x0;
      }
      self->__list = pPVar2;
      uVar3 = (uint)*(char *)pPVar2;
    }
    else {
      pvVar1 = pPVar2->list_[uVar3];
      if ((ushort)*(undefined4 *)pPVar2 < 0x100) {
        return pvVar1;
      }
      if (pvVar1 != (void *)0x0) {
        return pvVar1;
      }
    }
    uVar3 = uVar3 - 1;
    self->__nr = uVar3;
  } while( true );
}

Assistant:

void *raviX_ptrlist_iter_prev(PtrListIterator *self)
{
	if (self->__head == NULL)
		return NULL;
	self->__nr--;
Lretry:
	if (self->__nr >= 0 && self->__nr < self->__list->nr_) {
		void *ptr = self->__list->list_[self->__nr];
		if (self->__list->rm_ && !ptr) {
			self->__nr--;
			goto Lretry;
		}
		return ptr;
	} else if (self->__list->prev_ != self->__head) {
		self->__list = self->__list->prev_;
		self->__nr = self->__list->nr_ - 1;
		goto Lretry;
	}
	return NULL;
}